

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O3

Abc_Obj_t * Abc_NtkAddBuffsOne(Vec_Ptr_t *vBuffs,Abc_Obj_t *pFanin,int Level,int nLevelMax)

{
  uint uVar1;
  Abc_Obj_t *pAVar2;
  uint uVar3;
  
  uVar3 = *(uint *)&pFanin->field_0x14 >> 0xc;
  if (Level <= (int)uVar3) {
    __assert_fail("Level - 1 >= Abc_ObjLevel(pFanin)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcUtil.c"
                  ,0x901,"Abc_Obj_t *Abc_NtkAddBuffsOne(Vec_Ptr_t *, Abc_Obj_t *, int, int)");
  }
  uVar1 = pFanin->Id * nLevelMax + Level;
  if ((-1 < (int)uVar1) && ((int)uVar1 < vBuffs->nSize)) {
    pAVar2 = (Abc_Obj_t *)vBuffs->pArray[uVar1];
    if (pAVar2 == (Abc_Obj_t *)0x0) {
      pAVar2 = pFanin;
      if (Level - 1U != uVar3) {
        pAVar2 = Abc_NtkAddBuffsOne(vBuffs,pFanin,Level - 1U,nLevelMax);
      }
      pAVar2 = Abc_NtkCreateNodeBuf(pFanin->pNtk,pAVar2);
      uVar3 = nLevelMax * pFanin->Id + Level;
      if (((int)uVar3 < 0) || (vBuffs->nSize <= (int)uVar3)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
      }
      vBuffs->pArray[uVar3] = pAVar2;
    }
    return pAVar2;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

Abc_Obj_t * Abc_NtkAddBuffsOne( Vec_Ptr_t * vBuffs, Abc_Obj_t * pFanin, int Level, int nLevelMax )
{
    Abc_Obj_t * pBuffer;
    assert( Level - 1 >= Abc_ObjLevel(pFanin) );
    pBuffer = (Abc_Obj_t *)Vec_PtrEntry( vBuffs, Abc_ObjId(pFanin) * nLevelMax + Level );
    if ( pBuffer == NULL )
    {
        if ( Level - 1 == Abc_ObjLevel(pFanin) )
            pBuffer = pFanin;
        else
            pBuffer = Abc_NtkAddBuffsOne( vBuffs, pFanin, Level - 1, nLevelMax );
        pBuffer = Abc_NtkCreateNodeBuf( Abc_ObjNtk(pFanin), pBuffer ); 
        Vec_PtrWriteEntry( vBuffs, Abc_ObjId(pFanin) * nLevelMax + Level, pBuffer );
    }
    return pBuffer;
}